

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

void __thiscall amrex::AmrMesh::checkInput(AmrMesh *this)

{
  ostringstream *poVar1;
  int iVar2;
  pointer pGVar3;
  pointer pIVar4;
  pointer pIVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int idim;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Real RVar17;
  char local_1c9;
  long local_1c8;
  long local_1c0;
  Print local_1b8;
  
  iVar13 = (this->super_AmrInfo).max_level;
  if (iVar13 < 0) {
    Error_host("checkInput: max_level not set");
    iVar13 = (this->super_AmrInfo).max_level;
  }
  if (0 < iVar13) {
    lVar15 = 0;
    lVar14 = 0;
    do {
      lVar11 = 0;
      iVar12 = 0;
      do {
        iVar2 = *(int *)((long)((this->super_AmrInfo).ref_ratio.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start)->vect +
                        lVar11 * 4 + lVar15);
        if (iVar2 < iVar12) {
          iVar2 = iVar12;
        }
        iVar12 = iVar2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (iVar12 < 2) {
        Error_host("Amr::checkInput: bad ref_ratios");
        iVar13 = (this->super_AmrInfo).max_level;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < iVar13);
  }
  pGVar3 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((((pGVar3->domain).bigend.vect[0] < (pGVar3->domain).smallend.vect[0]) ||
       (*(int *)((long)&(pGVar3->domain).bigend + 4) <
        *(int *)((long)&(pGVar3->domain).smallend + 4))) ||
      (*(int *)((long)&(pGVar3->domain).bigend + 8) < *(int *)((long)&(pGVar3->domain).smallend + 8)
      )) || (7 < (pGVar3->domain).btype.itype)) {
    Error_host("level 0 domain bad or not set");
  }
  poVar1 = &local_1b8.ss;
  lVar14 = 0;
  do {
    iVar13 = ((this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start)->vect[lVar14];
    cVar7 = (char)poVar1;
    if (iVar13 <= ((this->super_AmrInfo).max_grid_size.
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_start)->vect[lVar14]) {
      iVar12 = (*(int *)((long)&(pGVar3->domain).bigend + lVar14 * 4) -
               *(int *)((long)&(pGVar3->domain).smallend + lVar14 * 4)) + 1;
      if (iVar12 % iVar13 != 0) {
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"domain size in direction ",0x19);
        std::ostream::operator<<(poVar1,(int)lVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," is ",4);
        std::ostream::operator<<(poVar1,iVar12);
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        Print::~Print(&local_1b8);
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"blocking_factor is ",0x13);
        std::ostream::operator<<
                  (poVar1,((this->super_AmrInfo).blocking_factor.
                           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           _M_impl.super__Vector_impl_data._M_start)->vect[lVar14]);
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        Print::~Print(&local_1b8);
        Error_host("domain size not divisible by blocking_factor");
      }
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (-1 < (this->super_AmrInfo).max_level) {
    lVar14 = 0;
    do {
      lVar15 = 0;
      do {
        uVar8 = (this->super_AmrInfo).blocking_factor.
                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14].vect[lVar15];
        do {
          uVar10 = uVar8;
          if ((int)uVar10 < 1) break;
          uVar8 = uVar10 >> 1;
        } while ((uVar10 & 1) == 0);
        if (uVar10 != 1) {
          Error_host(
                    "Amr::checkInput: blocking_factor not power of 2. You can bypass this by setting ParmParse runtime parameter amr.check_input=0, although we do not recommend it."
                    );
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      iVar13 = (this->super_AmrInfo).max_level;
      uVar9 = (ulong)iVar13;
      bVar6 = lVar14 < (long)uVar9;
      lVar14 = lVar14 + 1;
    } while (bVar6);
    if (0 < iVar13) {
      lVar14 = 0;
      lVar15 = 0;
      do {
        pIVar4 = (this->super_AmrInfo).ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar5 = (this->super_AmrInfo).blocking_factor.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((*(int *)((long)pIVar4->vect + lVar14) * *(int *)((long)pIVar5->vect + lVar14) <
              *(int *)((long)pIVar5[1].vect + lVar14)) ||
            (*(int *)((long)pIVar4->vect + lVar14 + 4) * *(int *)((long)pIVar5->vect + lVar14 + 4) <
             *(int *)((long)pIVar5[1].vect + lVar14 + 4U))) ||
           (*(int *)((long)pIVar4->vect + lVar14 + 8) * *(int *)((long)pIVar5->vect + lVar14 + 8) <
            *(int *)((long)pIVar5[1].vect + lVar14 + 8U))) {
          local_1b8.os = OutStream();
          local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
          local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
               *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Blocking factors on levels ",0x1b);
          std::ostream::operator<<(poVar1,(int)lVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and ",5);
          std::ostream::operator<<(poVar1,(int)lVar15 + 1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," are ",5);
          amrex::operator<<((ostream *)poVar1,
                            (IntVect *)
                            ((long)((this->super_AmrInfo).blocking_factor.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect + lVar14));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
          amrex::operator<<((ostream *)poVar1,
                            (IntVect *)
                            ((long)(this->super_AmrInfo).blocking_factor.
                                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].vect + lVar14));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,". Ref ratio is ",0xf);
          amrex::operator<<((ostream *)poVar1,
                            (IntVect *)
                            ((long)((this->super_AmrInfo).ref_ratio.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect + lVar14));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,".  They vary too much between levels.",0x25);
          std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          Print::~Print(&local_1b8);
          Error_host("Blocking factors vary too much between levels");
          uVar9 = (ulong)(uint)(this->super_AmrInfo).max_level;
        }
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0xc;
      } while (lVar15 < (int)uVar9);
      if (0 < (int)uVar9) {
        lVar15 = 0;
        lVar14 = 0;
        do {
          lVar11 = 3;
          iVar13 = 0;
          local_1c8 = lVar14;
          local_1c0 = lVar15;
          do {
            iVar12 = *(int *)((long)((this->super_AmrInfo).blocking_factor.
                                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vect + lVar15);
            iVar2 = *(int *)((long)((this->super_AmrInfo).max_grid_size.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect + lVar15);
            if ((iVar12 <= iVar2) && (iVar2 % iVar12 != 0)) {
              local_1b8.os = OutStream();
              local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
              local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
              *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                   *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"max_grid_size in direction ",0x1b);
              std::ostream::operator<<(poVar1,iVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," is ",4);
              std::ostream::operator<<
                        (poVar1,*(int *)((long)((this->super_AmrInfo).max_grid_size.
                                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                .
                                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->vect +
                                        lVar15));
              std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              Print::~Print(&local_1b8);
              local_1b8.os = OutStream();
              local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
              local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
              *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                   *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"blocking_factor is ",0x13);
              std::ostream::operator<<
                        (poVar1,*(int *)((long)((this->super_AmrInfo).blocking_factor.
                                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                .
                                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->vect +
                                        lVar15));
              std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              Print::~Print(&local_1b8);
              Error_host("max_grid_size not divisible by blocking_factor");
            }
            iVar13 = iVar13 + 1;
            lVar15 = lVar15 + 4;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          lVar14 = local_1c8 + 1;
          iVar13 = (this->super_AmrInfo).max_level;
          lVar15 = local_1c0 + 0xc;
        } while (lVar14 < iVar13);
        if (0 < iVar13) {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar11 = lVar14 + 1;
            lVar16 = 0;
            do {
              pIVar4 = (this->super_AmrInfo).blocking_factor.
                       super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar13 = *(int *)((long)pIVar4[1].vect + lVar16 * 4 + lVar15) /
                       *(int *)((long)((this->super_AmrInfo).ref_ratio.
                                       super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                       .
                                       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vect +
                               lVar16 * 4 + lVar15);
              if (iVar13 < 2) {
                iVar13 = 1;
              }
              iVar12 = *(int *)((long)pIVar4->vect + lVar16 * 4 + lVar15);
              iVar2 = *(int *)((long)((this->super_AmrInfo).max_grid_size.
                                      super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vect +
                              lVar16 * 4 + lVar15);
              if (iVar2 < iVar12) {
                iVar12 = iVar2;
              }
              if (iVar12 % iVar13 != 0) {
                local_1b8.os = OutStream();
                local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
                local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
                *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                     *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"On level ",9);
                std::ostream::operator<<(poVar1,(int)lVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," in direction ",0xe);
                std::ostream::operator<<(poVar1,(int)lVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," max_grid_size is ",0x12);
                std::ostream::operator<<
                          (poVar1,*(int *)((long)((this->super_AmrInfo).max_grid_size.
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                          lVar16 * 4 + lVar15));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," blocking factor is ",0x14);
                std::ostream::operator<<
                          (poVar1,*(int *)((long)((this->super_AmrInfo).blocking_factor.
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                          lVar16 * 4 + lVar15));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"On level ",9);
                std::ostream::operator<<(poVar1,(int)lVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," in direction ",0xe);
                std::ostream::operator<<(poVar1,(int)lVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," blocking_factor is ",0x14);
                std::ostream::operator<<
                          (poVar1,*(int *)((long)(this->super_AmrInfo).blocking_factor.
                                                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                 .
                                                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].vect +
                                          lVar16 * 4 + lVar15));
                std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar7);
                std::ostream::put(cVar7);
                std::ostream::flush();
                Print::~Print(&local_1b8);
                Error_host(
                          "Coarse level blocking factor not a multiple of fine level blocking factor divided by ref ratio"
                          );
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            lVar15 = lVar15 + 0xc;
            lVar14 = lVar11;
          } while (lVar11 < (this->super_AmrInfo).max_level);
        }
      }
    }
  }
  RVar17 = RealBox::volume(&((this->geom).
                             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                             _M_impl.super__Vector_impl_data._M_start)->prob_domain);
  if (RVar17 <= 0.0) {
    Error_host("Amr::checkInput: bad physical problem size");
  }
  if (0 < (this->super_AmrInfo).verbose) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
    poVar1 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Successfully read inputs file ... ",0x22);
    local_1c9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1c9,1);
    Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
AmrMesh::checkInput ()
{
    if (max_level < 0)
        amrex::Error("checkInput: max_level not set");

    //
    // Check level dependent values.
    //
    for (int i = 0; i < max_level; i++)
    {
        if (MaxRefRatio(i) < 2)
            amrex::Error("Amr::checkInput: bad ref_ratios");
    }

    const Box& domain = Geom(0).Domain();
    if (!domain.ok())
        amrex::Error("level 0 domain bad or not set");

    //
    // Check that domain size is a multiple of blocking_factor[0].
    //   (only check if blocking_factor <= max_grid_size)
    //
    for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
    {
        int len = domain.length(idim);
        if (blocking_factor[0][idim] <= max_grid_size[0][idim])
           if (len%blocking_factor[0][idim] != 0)
           {
              amrex::Print() << "domain size in direction " << idim << " is " << len << std::endl;
              amrex::Print() << "blocking_factor is " << blocking_factor[0][idim] << std::endl;
              amrex::Error("domain size not divisible by blocking_factor");
           }
    }

    //
    // Check that blocking_factor is a power of 2.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            int k = blocking_factor[i][idim];
            while ( k > 0 && (k%2 == 0) )
                k /= 2;
            if (k != 1)
                amrex::Error("Amr::checkInput: blocking_factor not power of 2. You can bypass this by setting ParmParse runtime parameter amr.check_input=0, although we do not recommend it.");
        }
    }

    //
    // Check that blocking_factor does not vary too much between levels
    //
    for (int i = 0; i < max_level; i++) {
        const IntVect bfrr = blocking_factor[i] * ref_ratio[i];
        if (!bfrr.allGE(blocking_factor[i+1])) {
            amrex::Print() << "Blocking factors on levels " << i << " and " << i+1
                           << " are " << blocking_factor[i] << " " << blocking_factor[i+1]
                           << ". Ref ratio is " << ref_ratio[i]
                           << ".  They vary too much between levels." << std::endl;
            amrex::Error("Blocking factors vary too much between levels");
        }
    }

    //
    // Check that max_grid_size is a multiple of blocking_factor at every level.
    //   (only check if blocking_factor <= max_grid_size)
    //
    for (int i = 0; i < max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
           if (blocking_factor[i][idim] <= max_grid_size[i][idim])
              if (max_grid_size[i][idim]%blocking_factor[i][idim] != 0) {
              {
                 amrex::Print() << "max_grid_size in direction " << idim
                                << " is " << max_grid_size[i][idim] << std::endl;
                 amrex::Print() << "blocking_factor is " << blocking_factor[i][idim] << std::endl;
                 amrex::Error("max_grid_size not divisible by blocking_factor");
              }
            }
        }
    }

    // Make sure TagBoxArray has no overlapped valid cells after coarsening by block_factor/ref_ratio
    for (int i = 0; i < max_level; ++i) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int bf_lev = std::max(1,blocking_factor[i+1][idim]/ref_ratio[i][idim]);
            int min_grid_size = std::min(blocking_factor[i][idim],max_grid_size[i][idim]);
            if (min_grid_size % bf_lev != 0) {
                amrex::Print() << "On level " << i << " in direction " << idim
                               << " max_grid_size is " << max_grid_size[i][idim]
                               << " blocking factor is " << blocking_factor[i][idim] << "\n"
                               << "On level " << i+1 << " in direction " << idim
                               << " blocking_factor is " << blocking_factor[i+1][idim] << std::endl;
                amrex::Error("Coarse level blocking factor not a multiple of fine level blocking factor divided by ref ratio");
            }
        }
    }

    if( ! (Geom(0).ProbDomain().volume() > 0.0) ) {
        amrex::Error("Amr::checkInput: bad physical problem size");
    }

    if(verbose > 0) {
        amrex::Print() << "Successfully read inputs file ... " << '\n';
    }
}